

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O1

void __thiscall MapWriter_write_Test::~MapWriter_write_Test(MapWriter_write_Test *this)

{
  pointer puVar1;
  
  (this->super_MapWriter).super_Test._vptr_Test = (_func_int **)&PTR__MapWriter_00197200;
  pstore::serialize::archive::vector_writer::~vector_writer(&(this->super_MapWriter).writer_);
  puVar1 = (this->super_MapWriter).bytes_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_MapWriter).bytes_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F (MapWriter, write) {
    std::vector<std::uint8_t> expected_bytes;
    pstore::serialize::archive::vector_writer expected{expected_bytes};

    pstore::serialize::write (expected, std::size_t{2});
    pstore::serialize::write (expected, "k1"s);
    pstore::serialize::write (expected, "First key"s);
    pstore::serialize::write (expected, "k2"s);
    pstore::serialize::write (expected, "Second key"s);

    auto const num_expected_bytes = std::distance (std::begin (expected), std::end (expected));
    auto const num_actual_bytes = std::distance (std::begin (writer_), std::end (writer_));
    ASSERT_EQ (num_expected_bytes, num_actual_bytes);

    EXPECT_TRUE (std::equal (std::begin (expected), std::end (expected), std::begin (writer_)));
}